

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

bool __thiscall
Js::TinyDictionary::TryGetValue<Memory::WriteBarrierPtr<Js::PropertyRecord_const>*>
          (TinyDictionary *this,PropertyId key,PropertyIndex *index,
          WriteBarrierPtr<const_Js::PropertyRecord> **data)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  uint32 uVar4;
  PropertyId PVar5;
  PropertyRecord *this_00;
  undefined4 *puVar6;
  byte local_3d;
  byte idx;
  byte i;
  uint32 bucketIndex;
  byte *buckets;
  WriteBarrierPtr<const_Js::PropertyRecord> **data_local;
  PropertyIndex *index_local;
  PropertyId key_local;
  TinyDictionary *this_local;
  
  uVar4 = ReduceKeyToIndex(this,key);
  local_3d = *(byte *)((long)this->bucketsData + (ulong)uVar4);
  if (local_3d == 0xff) {
LAB_011e0a99:
    this_local._7_1_ = false;
  }
  else {
    while( true ) {
      bVar2 = local_3d & 0x7f;
      this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->(*data + bVar2);
      PVar5 = PropertyRecord::GetPropertyId(this_00);
      if (PVar5 == key) break;
      if ((local_3d & 0x80) != 0) goto LAB_011e0a99;
      if ((*(char *)((long)this[1].bucketsData + (ulong)bVar2) != -1) &&
         ((*(byte *)((long)this[1].bucketsData + (ulong)bVar2) & 0x7f) == bVar2)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                    ,0x59,"(next[idx] == NIL || (next[idx] & 127) != idx)",
                                    "next[idx] == NIL || (next[idx] & 127) != idx");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_3d = *(byte *)((long)this[1].bucketsData + (ulong)bVar2);
    }
    *index = (ushort)bVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool TryGetValue(PropertyId key, PropertyIndex* index, const Data& data)
        {
            byte* buckets = reinterpret_cast<byte*>(bucketsData);
            uint32 bucketIndex = ReduceKeyToIndex(key);

            byte i = buckets[bucketIndex];
            if (i != NIL)
            {
                for(;;)
                {                    
                    byte idx = i & 127; // strip the sentinel bit

                    if (data[idx]->GetPropertyId() == key)
                    {
                        *index = idx;
                        return true;
                    }

                    if (i & 128)
                    {
                        // this was the last value in the chain
                        break;
                    }

                    Assert(next[idx] == NIL || (next[idx] & 127) != idx);
                    i = next[idx];
                }
            }

            return false;
        }